

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ExtensionSet::AddString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  bool bVar1;
  CppType CVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar3;
  LogMessage *pLVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  LogFinisher local_10a;
  byte local_109;
  LogMessage local_108;
  LogFinisher local_ca;
  byte local_c9;
  LogMessage local_c8;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  Extension *local_40;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  FieldType type_local;
  ExtensionSet *pEStack_28;
  int number_local;
  ExtensionSet *this_local;
  ExtensionSet *local_18;
  ExtensionSet *local_10;
  
  extension = (Extension *)descriptor;
  descriptor_local._3_1_ = type;
  descriptor_local._4_4_ = number;
  pEStack_28 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,&local_40);
  if (bVar1) {
    local_40->type = descriptor_local._3_1_;
    CVar2 = anon_unknown_22::cpp_type(local_40->type);
    local_79 = 0;
    if (CVar2 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x25f);
      local_79 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(local_8d,pLVar4);
    }
    if ((local_79 & 1) != 0) {
      LogMessage::~LogMessage(&local_78);
    }
    local_40->is_repeated = true;
    local_40->is_packed = false;
    this_local = (ExtensionSet *)this->arena_;
    local_18 = this_local;
    local_10 = this_local;
    pRVar3 = Arena::CreateMessageInternal<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                       ((Arena *)this_local);
    (local_40->field_0).repeated_string_value = pRVar3;
  }
  else {
    local_c9 = 0;
    if ((local_40->is_repeated & 1U) == 0) {
      LogMessage::LogMessage
                (&local_c8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x265);
      local_c9 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_c8,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                         );
      LogFinisher::operator=(&local_ca,pLVar4);
    }
    if ((local_c9 & 1) != 0) {
      LogMessage::~LogMessage(&local_c8);
    }
    CVar2 = anon_unknown_22::cpp_type(local_40->type);
    local_109 = 0;
    if (CVar2 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_108,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x265);
      local_109 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_108,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_10a,pLVar4);
    }
    if ((local_109 & 1) != 0) {
      LogMessage::~LogMessage(&local_108);
    }
  }
  pbVar5 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add((local_40->field_0).repeated_string_value);
  return pbVar5;
}

Assistant:

std::string* ExtensionSet::AddString(int number, FieldType type,
                                     const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = true;
    extension->is_packed = false;
    extension->repeated_string_value =
        Arena::CreateMessage<RepeatedPtrField<std::string>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, STRING);
  }
  return extension->repeated_string_value->Add();
}